

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsetpos.c
# Opt level: O3

int fsetpos(FILE *__stream,fpos_t *__pos)

{
  int iVar1;
  long lVar2;
  
  mtx_lock((mtx_t *)&__stream->_IO_save_base);
  if (((ulong)__stream->_IO_buf_end & 0x1000000000) == 0) {
LAB_001011a9:
    iVar1 = 0;
    lVar2 = _PDCLIB_seek((_PDCLIB_file_t *)__stream,__pos->__pos,0);
    if (lVar2 != -1) {
      *(int *)&__stream->_IO_write_end = (__pos->__state).__count;
      goto LAB_001011cd;
    }
  }
  else {
    iVar1 = _PDCLIB_flushbuffer((_PDCLIB_file_t *)__stream);
    if (iVar1 != -1) goto LAB_001011a9;
  }
  iVar1 = -1;
LAB_001011cd:
  mtx_unlock((mtx_t *)&__stream->_IO_save_base);
  return iVar1;
}

Assistant:

int fsetpos( struct _PDCLIB_file_t * stream, const struct _PDCLIB_fpos_t * pos )
{
    _PDCLIB_LOCK( stream->mtx );

    if ( stream->status & _PDCLIB_FWRITE )
    {
        if ( _PDCLIB_flushbuffer( stream ) == EOF )
        {
            _PDCLIB_UNLOCK( stream->mtx );
            return EOF;
        }
    }

    if ( _PDCLIB_seek( stream, pos->offset, SEEK_SET ) == EOF )
    {
        _PDCLIB_UNLOCK( stream->mtx );
        return EOF;
    }

    stream->pos.status = pos->status;
    /* TODO: Add mbstate. */

    _PDCLIB_UNLOCK( stream->mtx );

    return 0;
}